

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportConfig
          (cmExportFileGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  string suffix;
  string local_60 [32];
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>(local_60,"_",(allocator<char> *)&local_40);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)local_60);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_40,config);
    std::__cxx11::string::append(local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  (*this->_vptr_cmExportFileGenerator[0xd])(this,os,config,local_60,missingTargets);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportConfig(
  std::ostream& os, const std::string& config,
  std::vector<std::string>& missingTargets)
{
  // Construct the property configuration suffix.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // Generate the per-config target information.
  this->GenerateImportTargetsConfig(os, config, suffix, missingTargets);
}